

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O1

void __thiscall Function::~Function(Function *this)

{
  list<Atom_*,_std::allocator<Atom_*>_> *plVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  plVar1 = &this->body;
  for (p_Var3 = (this->body).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node.
                super__List_node_base._M_next; p_Var3 != (_List_node_base *)plVar1;
      p_Var3 = p_Var3->_M_next) {
    if (p_Var3[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 8))();
    }
    p_Var3[1]._M_next = (_List_node_base *)0x0;
  }
  p_Var3 = (plVar1->super__List_base<Atom_*,_std::allocator<Atom_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)plVar1) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var2;
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this);
  return;
}

Assistant:

Function::~Function() {
    for (auto &i: body) {
        delete i;
        i = NULL;
    }
}